

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizationFactory.cpp
# Opt level: O0

bool __thiscall
OpenMD::OptimizationFactory::registerOptimization
          (OptimizationFactory *this,OptimizationCreator *creator)

{
  byte bVar1;
  OptimizationCreator *in_RSI;
  value_type *in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::OptimizationCreator_*>_>,_bool>
  pVar2;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::OptimizationCreator_*>
  *this_00;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::OptimizationCreator_*>
  local_48;
  _Base_ptr local_20;
  undefined1 local_18;
  
  OptimizationCreator::getIdent_abi_cxx11_(in_RSI);
  this_00 = &local_48;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::OptimizationCreator_*>
  ::pair<OpenMD::OptimizationCreator_*&,_true>
            (this_00,&in_RDI->first,
             (OptimizationCreator **)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::OptimizationCreator_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::OptimizationCreator_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::OptimizationCreator_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::OptimizationCreator_*>_>_>
                    *)this_00,in_RDI);
  local_20 = (_Base_ptr)pVar2.first._M_node;
  bVar1 = pVar2.second;
  local_18 = bVar1;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::OptimizationCreator_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::OptimizationCreator_*>
           *)0x2aa201);
  return (bool)(bVar1 & 1);
}

Assistant:

bool OptimizationFactory::registerOptimization(OptimizationCreator* creator) {
    return creatorMap_
        .insert(CreatorMapType::value_type(creator->getIdent(), creator))
        .second;
  }